

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O0

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,BinaryOperatorExpression *expression)

{
  ostream *poVar1;
  bool bVar2;
  OperatorChar OVar3;
  Expression *pEVar4;
  OperatorChar local_c3;
  string local_c0;
  OperatorChar local_9f;
  OperatorChar local_9c;
  byte local_99;
  undefined1 auStack_98 [7];
  bool addSpaces;
  BinaryOperatorExpression **local_90;
  ExpressionPredicate local_88;
  byte local_65;
  bool needRightSideParentheses;
  anon_class_16_2_18ae7f13 local_58;
  ExpressionPredicate local_48;
  byte local_21;
  BinaryOperatorExpression *pBStack_20;
  bool needLeftSideParentheses;
  BinaryOperatorExpression *expression_local;
  Expression *parent_local;
  PrintVisitor *this_local;
  
  local_58.expression = &stack0xffffffffffffffe0;
  local_58.this = this;
  pBStack_20 = expression;
  expression_local = (BinaryOperatorExpression *)parent;
  parent_local = (Expression *)this;
  std::function<bool(Expression*)>::
  function<PrintVisitor::visit(Expression*,BinaryOperatorExpression*)::__0,void>
            ((function<bool(Expression*)> *)&local_48,&local_58);
  pEVar4 = BinaryOperatorExpression::leftHandSide(pBStack_20);
  bVar2 = PredicateVisitor::apply(&local_48,pEVar4);
  std::function<bool_(Expression_*)>::~function(&local_48);
  local_90 = &stack0xffffffffffffffe0;
  _auStack_98 = this;
  local_21 = bVar2;
  std::function<bool(Expression*)>::
  function<PrintVisitor::visit(Expression*,BinaryOperatorExpression*)::__1,void>
            ((function<bool(Expression*)> *)&local_88,(anon_class_16_2_18ae7f13 *)auStack_98);
  pEVar4 = BinaryOperatorExpression::rightHandSide(pBStack_20);
  bVar2 = PredicateVisitor::apply(&local_88,pEVar4);
  std::function<bool_(Expression_*)>::~function(&local_88);
  local_65 = bVar2;
  if ((local_21 & 1) != 0) {
    std::operator<<(this->mStream,"(");
  }
  pEVar4 = BinaryOperatorExpression::leftHandSide(pBStack_20);
  (*pEVar4->_vptr_Expression[2])(pEVar4,this,pBStack_20);
  if ((local_21 & 1) != 0) {
    std::operator<<(this->mStream,")");
  }
  OVar3 = BinaryOperatorExpression::op(pBStack_20);
  local_9c._0_2_ = OVar3._0_2_;
  local_9c.mOp2 = OVar3.mOp2;
  OperatorChar::OperatorChar(&local_9f,'^');
  local_99 = OperatorChar::operator!=(&local_9c,&local_9f);
  if ((bool)local_99) {
    std::operator<<(this->mStream," ");
  }
  poVar1 = this->mStream;
  OVar3 = BinaryOperatorExpression::op(pBStack_20);
  local_c3._0_2_ = OVar3._0_2_;
  local_c3.mOp2 = OVar3.mOp2;
  OperatorChar::toString_abi_cxx11_(&local_c0,&local_c3);
  std::operator<<(poVar1,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if ((local_99 & 1) != 0) {
    std::operator<<(this->mStream," ");
  }
  if ((local_65 & 1) != 0) {
    std::operator<<(this->mStream,"(");
  }
  pEVar4 = BinaryOperatorExpression::rightHandSide(pBStack_20);
  (*pEVar4->_vptr_Expression[2])(pEVar4,this,pBStack_20);
  if ((local_65 & 1) != 0) {
    std::operator<<(this->mStream,")");
  }
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, BinaryOperatorExpression* expression) {
	auto needLeftSideParentheses = PredicateVisitor::apply(
		[&](Expression* innerExpression) { return needParentheses(innerExpression, expression->op()); },
		expression->leftHandSide());

	auto needRightSideParentheses = PredicateVisitor::apply(
		[&](Expression* innerExpression) { return needParentheses(innerExpression, expression->op()); },
		expression->rightHandSide());

	if (needLeftSideParentheses) {
		mStream << "(";
	}

	expression->leftHandSide()->accept(*this, expression);

	if (needLeftSideParentheses) {
		mStream << ")";
	}

	bool addSpaces = expression->op() != OperatorChar('^');

	if (addSpaces) {
		mStream << " ";
	}

	mStream << expression->op().toString();

	if (addSpaces) {
		mStream << " ";
	}

	if (needRightSideParentheses) {
		mStream << "(";
	}

	expression->rightHandSide()->accept(*this, expression);

	if (needRightSideParentheses) {
		mStream << ")";
	}
}